

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

void cmd_ln_val_free(cmd_ln_val_t *val)

{
  undefined8 *ptr;
  void *ptr_00;
  undefined8 *puVar1;
  
  if (((val->type & 0x20) != 0) && (ptr = (undefined8 *)(val->val).ptr, ptr != (undefined8 *)0x0)) {
    ptr_00 = (void *)*ptr;
    puVar1 = ptr;
    while (ptr_00 != (void *)0x0) {
      puVar1 = puVar1 + 1;
      ckd_free(ptr_00);
      ptr_00 = (void *)*puVar1;
    }
    ckd_free(ptr);
  }
  if ((val->type & 8) != 0) {
    ckd_free((val->val).ptr);
  }
  ckd_free(val->name);
  ckd_free(val);
  return;
}

Assistant:

void
cmd_ln_val_free(cmd_ln_val_t *val)
{
    int i;
    if (val->type & ARG_STRING_LIST) {
        char ** array = (char **)val->val.ptr;
        if (array) {
            for (i = 0; array[i] != NULL; i++) {
                ckd_free(array[i]);
            }
            ckd_free(array);
        }
    }
    if (val->type & ARG_STRING)
        ckd_free(val->val.ptr);
    ckd_free(val->name);
    ckd_free(val);
}